

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_util.cpp
# Opt level: O3

void duckdb::ExtensionUtil::RegisterFunction(DatabaseInstance *db,PragmaFunction *function)

{
  vector<duckdb::PragmaFunction,_true> *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  PragmaFunctionSet set;
  __alloc_node_gen_t __alloc_node_gen;
  PragmaFunctionSet local_1d8;
  string local_1a0;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
  local_180;
  PragmaFunctionSet local_178;
  undefined1 local_140 [144];
  __buckets_ptr local_b0;
  size_type local_a8;
  __node_base local_a0;
  size_type local_98;
  _Prime_rehash_policy local_90;
  __node_base_ptr local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  pragma_function_t local_68;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_60;
  
  pcVar3 = (function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.name.
           _M_dataplus._M_p;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar3,
             pcVar3 + (function->super_SimpleNamedParameterFunction).super_SimpleFunction.
                      super_Function.name._M_string_length);
  PragmaFunctionSet::PragmaFunctionSet(&local_1d8,&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  SimpleFunction::SimpleFunction((SimpleFunction *)local_140,(SimpleFunction *)function);
  local_140._0_8_ = &PTR__SimpleNamedParameterFunction_02433108;
  local_180._M_h = (__hashtable_alloc *)&local_b0;
  local_b0 = (__buckets_ptr)0x0;
  local_a8 = (function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_bucket_count;
  local_a0._M_nxt = (_Hash_node_base *)0x0;
  local_98 = (function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_element_count;
  local_90._M_max_load_factor =
       (function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_90._4_4_ =
       *(undefined4 *)
        &(function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
         field_0x4;
  local_90._M_next_resize =
       (function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_80 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_180._M_h,&(function->super_SimpleNamedParameterFunction).named_parameters._M_h
             ,&local_180);
  local_140._0_8_ = &PTR__PragmaFunction_02435b40;
  local_78._0_1_ = function->type;
  local_78._1_3_ = *(undefined3 *)&function->field_0xc9;
  uStack_74 = *(undefined4 *)&function->field_0xcc;
  uStack_70 = *(undefined4 *)&function->query;
  uStack_6c = *(undefined4 *)((long)&function->query + 4);
  local_68 = function->function;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_60,&function->named_parameters,&function->named_parameters);
  this = &local_1d8.super_FunctionSet<duckdb::PragmaFunction>.functions;
  ::std::vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>::
  emplace_back<duckdb::PragmaFunction>
            (&this->super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>,
             (PragmaFunction *)local_140);
  local_140._0_8_ = &PTR__PragmaFunction_02435b40;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_60);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_140);
  paVar1 = &local_178.super_FunctionSet<duckdb::PragmaFunction>.name.field_2;
  paVar2 = &local_1d8.super_FunctionSet<duckdb::PragmaFunction>.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p == paVar2) {
    local_178.super_FunctionSet<duckdb::PragmaFunction>.name.field_2._8_8_ =
         local_1d8.super_FunctionSet<duckdb::PragmaFunction>.name.field_2._8_8_;
    local_178.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_178.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p =
         local_1d8.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p;
  }
  local_178.super_FunctionSet<duckdb::PragmaFunction>.name._M_string_length =
       local_1d8.super_FunctionSet<duckdb::PragmaFunction>.name._M_string_length;
  local_1d8.super_FunctionSet<duckdb::PragmaFunction>.name._M_string_length = 0;
  local_1d8.super_FunctionSet<duckdb::PragmaFunction>.name.field_2._M_local_buf[0] = '\0';
  local_178.super_FunctionSet<duckdb::PragmaFunction>.functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1d8.super_FunctionSet<duckdb::PragmaFunction>.functions.
       super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
       super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_178.super_FunctionSet<duckdb::PragmaFunction>.functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1d8.super_FunctionSet<duckdb::PragmaFunction>.functions.
       super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
       super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_178.super_FunctionSet<duckdb::PragmaFunction>.functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1d8.super_FunctionSet<duckdb::PragmaFunction>.functions.
       super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
       super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1d8.super_FunctionSet<duckdb::PragmaFunction>.functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.super_FunctionSet<duckdb::PragmaFunction>.functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super_FunctionSet<duckdb::PragmaFunction>.functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p = (pointer)paVar2;
  RegisterFunction(db,&local_178);
  ::std::vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>::~vector
            (&local_178.super_FunctionSet<duckdb::PragmaFunction>.functions.
              super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_178.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p);
  }
  ::std::vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>::~vector
            (&this->super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ExtensionUtil::RegisterFunction(DatabaseInstance &db, PragmaFunction function) {
	D_ASSERT(!function.name.empty());
	PragmaFunctionSet set(function.name);
	set.AddFunction(std::move(function));
	RegisterFunction(db, std::move(set));
}